

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict2pid.c
# Opt level: O1

void dict2pid_dump(FILE *fp,dict2pid_t *d2p)

{
  bin_mdef_t *m;
  dict_t *pdVar1;
  s3ssid_t sVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  int pos;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  m = d2p->mdef;
  pdVar1 = d2p->dict;
  fwrite("# INTERNAL (wd comssid ssid ssid ... ssid comssid)\n",0x33,1,(FILE *)fp);
  if (0 < pdVar1->n_word) {
    lVar6 = 0;
    do {
      fprintf((FILE *)fp,"%30s ",pdVar1->word[lVar6].word);
      iVar7 = pdVar1->word[lVar6].pronlen;
      if (0 < iVar7) {
        pos = 0;
        do {
          sVar2 = dict2pid_internal(d2p,(int32)lVar6,pos);
          fprintf((FILE *)fp," %5d",(ulong)sVar2);
          pos = pos + 1;
        } while (iVar7 != pos);
      }
      fputc(10,(FILE *)fp);
      lVar6 = lVar6 + 1;
    } while (lVar6 < pdVar1->n_word);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fwrite("# LDIPH_LC (b r l ssid)\n",0x18,1,(FILE *)fp);
  if (0 < m->n_ciphone) {
    lVar6 = 0;
    do {
      if (0 < m->n_ciphone) {
        lVar10 = 0;
        do {
          if (0 < m->n_ciphone) {
            iVar7 = 0;
            lVar9 = 0;
            do {
              if (d2p->ldiph_lc[lVar6][lVar10][lVar9] != 0xffff) {
                pcVar3 = bin_mdef_ciphone_str(m,(int)(short)lVar6);
                pcVar4 = bin_mdef_ciphone_str(m,(int)(short)lVar10);
                pcVar5 = bin_mdef_ciphone_str(m,iVar7 >> 0x10);
                fprintf((FILE *)fp,"%6s %6s %6s %5d\n",pcVar3,pcVar4,pcVar5,
                        (ulong)d2p->ldiph_lc[lVar6][lVar10][lVar9]);
              }
              lVar9 = lVar9 + 1;
              iVar7 = iVar7 + 0x10000;
            } while (lVar9 < m->n_ciphone);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < m->n_ciphone);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < m->n_ciphone);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fprintf((FILE *)fp,"# SSEQ %d (senid senid ...)\n",(ulong)(uint)m->n_sseq);
  if (0 < m->n_sseq) {
    uVar8 = 0;
    do {
      fprintf((FILE *)fp,"%5d ",uVar8 & 0xffffffff);
      if (0 < m->n_emit_state) {
        lVar6 = 0;
        do {
          fprintf((FILE *)fp," %5d",(ulong)m->sseq[uVar8][lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 < m->n_emit_state);
      }
      fputc(10,(FILE *)fp);
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)m->n_sseq);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fwrite("# END\n",6,1,(FILE *)fp);
  fflush((FILE *)fp);
  return;
}

Assistant:

void
dict2pid_dump(FILE * fp, dict2pid_t * d2p)
{
    int32 w, p, pronlen;
    int32 i, j, b, l, r;
    bin_mdef_t *mdef = d2p->mdef;
    dict_t *dict = d2p->dict;

    fprintf(fp, "# INTERNAL (wd comssid ssid ssid ... ssid comssid)\n");
    for (w = 0; w < dict_size(dict); w++) {
        fprintf(fp, "%30s ", dict_wordstr(dict, w));

        pronlen = dict_pronlen(dict, w);
        for (p = 0; p < pronlen; p++)
            fprintf(fp, " %5d", dict2pid_internal(d2p, w, p));
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# LDIPH_LC (b r l ssid)\n");
    for (b = 0; b < bin_mdef_n_ciphone(mdef); b++) {
        for (r = 0; r < bin_mdef_n_ciphone(mdef); r++) {
            for (l = 0; l < bin_mdef_n_ciphone(mdef); l++) {
                if (IS_S3SSID(d2p->ldiph_lc[b][r][l]))
                    fprintf(fp, "%6s %6s %6s %5d\n", bin_mdef_ciphone_str(mdef, (s3cipid_t) b), bin_mdef_ciphone_str(mdef, (s3cipid_t) r), bin_mdef_ciphone_str(mdef, (s3cipid_t) l), d2p->ldiph_lc[b][r][l]);      /* RAH, ldiph_lc is returning an int32, %d expects an int16 */
            }
        }
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# SSEQ %d (senid senid ...)\n", mdef->n_sseq);
    for (i = 0; i < mdef->n_sseq; i++) {
        fprintf(fp, "%5d ", i);
        for (j = 0; j < bin_mdef_n_emit_state(mdef); j++)
            fprintf(fp, " %5d", mdef->sseq[i][j]);
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");
    fprintf(fp, "# END\n");

    fflush(fp);
}